

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O2

void __thiscall
websocketpp::endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
::set_message_handler
          (endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
           *this,message_handler *h)

{
  size_t in_RCX;
  
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            ((this->m_alog).
             super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,0x400,"set_message_handler",in_RCX);
  std::mutex::lock(&this->m_mutex);
  std::
  function<void_(std::weak_ptr<void>,_std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>)>
  ::operator=(&this->m_message_handler,h);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

void set_message_handler(message_handler h) {
        m_alog->write(log::alevel::devel,"set_message_handler");
        scoped_lock_type guard(m_mutex);
        m_message_handler = h;
    }